

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GenerateCxxModuleInformation(cmExportFileGenerator *this,ostream *os)

{
  ostream *poVar1;
  string path;
  string cxx_module_dirname;
  string trampoline_path;
  cmAlphaNum local_2b0;
  cmGeneratedFileStream ap;
  
  (*this->_vptr_cmExportFileGenerator[0x15])(&cxx_module_dirname,this);
  if (cxx_module_dirname._M_string_length != 0) {
    poVar1 = std::operator<<(os,"# Include C++ module properties\n");
    poVar1 = std::operator<<(poVar1,"include(\"${CMAKE_CURRENT_LIST_DIR}/");
    poVar1 = std::operator<<(poVar1,(string *)&cxx_module_dirname);
    std::operator<<(poVar1,"/cxx-modules.cmake\")\n\n");
    std::__cxx11::string::string((string *)&path,(string *)&this->MainImportFile);
    cmsys::SystemTools::GetFilenamePath((string *)&ap,&path);
    std::__cxx11::string::operator=((string *)&path,(string *)&ap);
    std::__cxx11::string::~string((string *)&ap);
    ap.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)path._M_string_length;
    ap.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         path._M_dataplus._M_p;
    local_2b0.View_._M_str = local_2b0.Digits_;
    local_2b0.View_._M_len = 1;
    local_2b0.Digits_[0] = '/';
    cmStrCat<std::__cxx11::string,char[19]>
              (&trampoline_path,(cmAlphaNum *)&ap,&local_2b0,&cxx_module_dirname,
               (char (*) [19])"/cxx-modules.cmake");
    cmGeneratedFileStream::cmGeneratedFileStream(&ap,&trampoline_path,true,None);
    cmGeneratedFileStream::SetCopyIfDifferent(&ap,true);
    (*this->_vptr_cmExportFileGenerator[0x16])(this,&ap);
    cmGeneratedFileStream::~cmGeneratedFileStream(&ap);
    std::__cxx11::string::~string((string *)&trampoline_path);
    std::__cxx11::string::~string((string *)&path);
  }
  std::__cxx11::string::~string((string *)&cxx_module_dirname);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateCxxModuleInformation(std::ostream& os)
{
  auto const cxx_module_dirname = this->GetCxxModulesDirectory();
  if (cxx_module_dirname.empty()) {
    return;
  }

  // Write the include.
  os << "# Include C++ module properties\n"
     << "include(\"${CMAKE_CURRENT_LIST_DIR}/" << cxx_module_dirname
     << "/cxx-modules.cmake\")\n\n";

  // Get the path to the file we're going to write.
  std::string path = this->MainImportFile;
  path = cmSystemTools::GetFilenamePath(path);
  auto trampoline_path =
    cmStrCat(path, '/', cxx_module_dirname, "/cxx-modules.cmake");

  // Include all configuration-specific include files.
  cmGeneratedFileStream ap(trampoline_path, true);
  ap.SetCopyIfDifferent(true);

  this->GenerateCxxModuleConfigInformation(ap);
}